

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

UniformValue * __thiscall
glcts::anon_unknown_0::UniformValue::operator=(UniformValue *this,UniformValue *param_1)

{
  UniformValue *param_1_local;
  UniformValue *this_local;
  
  std::vector<float,_std::allocator<float>_>::operator=(&this->fValues,&param_1->fValues);
  std::vector<int,_std::allocator<int>_>::operator=(&this->iValues,&param_1->iValues);
  std::vector<int,_std::allocator<int>_>::operator=(&this->uValues,&param_1->uValues);
  UniformType::operator=(&this->type,&param_1->type);
  return this;
}

Assistant:

void streamValue(std::ostringstream& str, int arrayElement = 0, int column = 0) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;

		str << type.refStr() << "(";

		if (type.getBaseType() == GL_SAMPLER)
		{
			for (size_t elem = 0; elem < 4; elem++)
			{
				if (elem)
					str << ", ";
				str << fValues[arrayElement * 4 + elem];
			}
			str << ")";
			return;
		}

		for (int elem = 0; fValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << fValues[arrayElement * arrayElementSize + column * type.getSize().first + elem] << ".0";
		}
		for (int elem = 0; iValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << iValues[arrayElement * arrayElementSize + elem];
		}
		for (int elem = 0; uValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << uValues[arrayElement * arrayElementSize + elem] << "u";
		}
		str << ")";
	}